

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestDyndepFileReady::Run(GraphTestDyndepFileReady *this)

{
  Test *pTVar1;
  bool bVar2;
  bool bVar3;
  Node *pNVar4;
  Edge *this_00;
  VirtualFileSystem *this_01;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  uint local_1b0;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_188 [8];
  string err;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  ManifestParserOptions local_18;
  GraphTestDyndepFileReady *local_10;
  GraphTestDyndepFileReady *this_local;
  
  local_10 = this;
  ManifestParserOptions::ManifestParserOptions(&local_18);
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild dd: r dd-in\nbuild out: r || dd\n  dyndep = dd\n",
              local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"dd-in",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"dd",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"ninja_dyndep_version = 1\nbuild out: dyndep | in\n",&local_c1);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"out",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_e8,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  this_01 = &(this->super_GraphTest).fs_;
  VirtualFileSystem::Tick(this_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"in",&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
  VirtualFileSystem::Create(this_01,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::string((string *)local_188);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"out",&local_1a9);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_1a8);
  bVar2 = DependencyScan::RecomputeDirty
                    (&(this->super_GraphTest).scan_,pNVar4,
                     (vector<Node_*,_std::allocator<Node_*>_> *)0x0,(string *)local_188);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc",
             0x325,"scan_.RecomputeDirty(GetNode(\"out\"), NULL, &err)");
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_188);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x326,"\"\" == err");
  pTVar1 = g_current_test;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"in",&local_1d1);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_1d0);
    bVar3 = Node::dirty(pNVar4);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x328,"GetNode(\"in\")->dirty()");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"dd",&local_1f9);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_1f8);
    bVar3 = Node::dirty(pNVar4);
    testing::Test::Check
              (pTVar1,(bool)(~bVar3 & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x329,"GetNode(\"dd\")->dirty()");
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"dd",&local_221);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_220);
    this_00 = Node::in_edge(pNVar4);
    bVar3 = Edge::outputs_ready(this_00);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x32a,"GetNode(\"dd\")->in_edge()->outputs_ready()");
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"out",&local_249);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_248);
    bVar3 = Node::dirty(pNVar4);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x32d,"GetNode(\"out\")->dirty()");
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator(&local_249);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  local_1b0 = (uint)!bVar2;
  std::__cxx11::string::~string((string *)local_188);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepFileReady) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build dd: r dd-in\n"
"build out: r || dd\n"
"  dyndep = dd\n"
  );
  fs_.Create("dd-in", "");
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
"build out: dyndep | in\n"
  );
  fs_.Create("out", "");
  fs_.Tick();
  fs_.Create("in", "");

  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("out"), NULL, &err));
  ASSERT_EQ("", err);

  EXPECT_FALSE(GetNode("in")->dirty());
  EXPECT_FALSE(GetNode("dd")->dirty());
  EXPECT_TRUE(GetNode("dd")->in_edge()->outputs_ready());

  // "out" is dirty due to dyndep-specified implicit input
  EXPECT_TRUE(GetNode("out")->dirty());
}